

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

size_t qHash(QUrlQuery *key,size_t seed)

{
  char16_t cVar1;
  char16_t cVar2;
  QUrlQueryPrivate *pQVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  pQVar3 = (key->d).d.ptr;
  if (pQVar3 != (QUrlQueryPrivate *)0x0) {
    cVar1 = (pQVar3->valueDelimiter).ucs;
    cVar2 = (pQVar3->pairDelimiter).ucs;
    sVar4 = qHash<std::pair<QString,QString>>(&pQVar3->itemList,0);
    uVar6 = (ulong)(ushort)cVar1 * -0x2917014799a6026d;
    uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
    uVar6 = (seed >> 2) + seed * 0x40 + 0x9e3779b9 + (uVar6 >> 0x20 ^ uVar6) ^ seed;
    uVar5 = (ulong)(ushort)cVar2 * -0x2917014799a6026d;
    uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
    uVar6 = (uVar6 >> 2) + 0x9e3779b9 + (uVar5 >> 0x20 ^ uVar5) + uVar6 * 0x40 ^ uVar6;
    seed = (uVar6 >> 2) + 0x9e3779b9 + sVar4 + uVar6 * 0x40 ^ uVar6;
  }
  return seed;
}

Assistant:

size_t qHash(const QUrlQuery &key, size_t seed) noexcept
{
    if (const QUrlQueryPrivate *d = key.d) {
        QtPrivate::QHashCombine hash;
        // keep in sync with operator==:
        seed = hash(seed, d->valueDelimiter);
        seed = hash(seed, d->pairDelimiter);
        seed = hash(seed, d->itemList);
    }
    return seed;
}